

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

bool __thiscall
OSSLRSA::reconstructKeyPair(OSSLRSA *this,AsymmetricKeyPair **ppKeyPair,ByteString *serialisedData)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  long *__s;
  long *plVar4;
  undefined8 *in_RSI;
  bool rv;
  OSSLRSAKeyPair *kp;
  ByteString dPriv;
  ByteString dPub;
  OSSLRSAKeyPair *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 local_70 [40];
  undefined1 local_48 [48];
  undefined8 *local_18;
  byte local_1;
  
  if ((in_RSI == (undefined8 *)0x0) ||
     (local_18 = in_RSI, sVar3 = ByteString::size((ByteString *)0x1c1cf7), sVar3 == 0)) {
    local_1 = 0;
  }
  else {
    ByteString::chainDeserialise
              ((ByteString *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    ByteString::chainDeserialise
              ((ByteString *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    __s = (long *)operator_new(0x1b8);
    memset(__s,0,0x1b8);
    OSSLRSAKeyPair::OSSLRSAKeyPair(in_stack_ffffffffffffff50);
    plVar4 = (long *)(**(code **)(*__s + 0x18))();
    bVar1 = (**(code **)(*plVar4 + 0x50))(plVar4,local_48);
    plVar4 = (long *)(**(code **)(*__s + 0x28))();
    bVar2 = (**(code **)(*plVar4 + 0xc0))(plVar4,local_70);
    if ((bVar2 & 1) == 0 || (bVar1 & 1) == 0) {
      if (__s != (long *)0x0) {
        (**(code **)(*__s + 0x10))();
      }
      local_1 = 0;
    }
    else {
      *local_18 = __s;
      local_1 = 1;
    }
    ByteString::~ByteString((ByteString *)0x1c1e93);
    ByteString::~ByteString((ByteString *)0x1c1ea0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLRSA::reconstructKeyPair(AsymmetricKeyPair** ppKeyPair, ByteString& serialisedData)
{
	// Check input
	if ((ppKeyPair == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	ByteString dPub = ByteString::chainDeserialise(serialisedData);
	ByteString dPriv = ByteString::chainDeserialise(serialisedData);

	OSSLRSAKeyPair* kp = new OSSLRSAKeyPair();

	bool rv = true;

	if (!((RSAPublicKey*) kp->getPublicKey())->deserialise(dPub))
	{
		rv = false;
	}

	if (!((RSAPrivateKey*) kp->getPrivateKey())->deserialise(dPriv))
	{
		rv = false;
	}

	if (!rv)
	{
		delete kp;

		return false;
	}

	*ppKeyPair = kp;

	return true;
}